

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O0

int b_rshift(lua_State *L)

{
  lua_Unsigned r;
  int iVar1;
  lua_Integer lVar2;
  lua_State *L_local;
  
  r = luaL_checkunsigned(L,1);
  lVar2 = luaL_checkinteger(L,2);
  iVar1 = b_shift(L,r,-(int)lVar2);
  return iVar1;
}

Assistant:

static int b_rshift (lua_State *L) {
  return b_shift(L, luaL_checkunsigned(L, 1), -luaL_checkint(L, 2));
}